

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::searchforth(Forth *this)

{
  pointer piVar1;
  
  piVar1 = (this->searchOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar1 != (this->searchOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start) {
    piVar1[-1] = this->widForthWordList;
    return;
  }
  std::vector<int,_std::allocator<int>_>::push_back(&this->searchOrder,&this->widForthWordList);
  return;
}

Assistant:

void searchforth(){
			if(searchOrder.size()>0){
				searchOrder[searchOrder.size()-1]=widForthWordList;	
			}else {
				searchOrder.push_back(widForthWordList);
			}	
		}